

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ReusableStringStream::~ReusableStringStream(ReusableStringStream *this)

{
  string *psVar1;
  StringStreams *this_00;
  allocator local_31;
  string local_30 [32];
  ReusableStringStream *local_10;
  ReusableStringStream *this_local;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_00363158;
  psVar1 = (string *)this->m_oss;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  std::__cxx11::ostringstream::str(psVar1);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::ios::clear(this->m_oss + *(long *)(*(long *)this->m_oss + -0x18),0);
  this_00 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getMutable
                      ();
  StringStreams::release(this_00,this->m_index);
  NonCopyable::~NonCopyable(&this->super_NonCopyable);
  return;
}

Assistant:

ReusableStringStream::~ReusableStringStream() {
        static_cast<std::ostringstream*>( m_oss )->str("");
        m_oss->clear();
        Singleton<StringStreams>::getMutable().release( m_index );
    }